

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.h
# Opt level: O2

bool __thiscall
GGSock::Unserialize::operator()
          (Unserialize *this,
          map<int,_GGSock::FileServer::FileInfo,_std::less<int>,_std::allocator<std::pair<const_int,_GGSock::FileServer::FileInfo>_>_>
          *t,char *bufferData,size_t bufferSize,size_t *offset)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  mapped_type *this_00;
  int iVar4;
  int k;
  int32_t n;
  FileInfo v;
  key_type kStack_a8;
  int local_a4;
  FileInfo *local_a0;
  char *local_98;
  ulong *local_90;
  map<int,_GGSock::FileServer::FileInfo,_std::less<int>,_std::allocator<std::pair<const_int,_GGSock::FileServer::FileInfo>_>_>
  *local_88;
  FileInfo local_80;
  
  local_a4 = 0;
  local_a0 = (FileInfo *)this;
  local_98 = bufferData;
  local_90 = (ulong *)bufferSize;
  local_88 = t;
  bVar1 = GGSock::Unserialize::operator()
                    ((int *)this,(char *)&local_a4,(ulong)bufferData,(ulong *)bufferSize);
  for (iVar4 = 0; iVar4 < local_a4; iVar4 = iVar4 + 1) {
    FileServer::FileInfo::FileInfo(&local_80);
    bVar2 = GGSock::Unserialize::operator()
                      ((int *)local_a0,(char *)&kStack_a8,(ulong)local_98,local_90);
    bVar3 = GGSock::Unserialize::operator()(local_a0,(char *)&local_80,(ulong)local_98,local_90);
    this_00 = std::
              map<int,_GGSock::FileServer::FileInfo,_std::less<int>,_std::allocator<std::pair<const_int,_GGSock::FileServer::FileInfo>_>_>
              ::operator[](local_88,&kStack_a8);
    bVar1 = (bool)(bVar1 & (bVar2 && bVar3));
    FileServer::FileInfo::operator=(this_00,&local_80);
    FileServer::FileInfo::~FileInfo(&local_80);
  }
  return bVar1;
}

Assistant:

bool Unserialize::operator()(std::map<Key, Value> & t, const char * bufferData, size_t bufferSize, size_t & offset) {
    bool res = true;

    int32_t n = 0;
    res &= operator()(n, bufferData, bufferSize, offset);
    for (int i = 0; i < n; ++i) {
        Key k;
        Value v;
        res &= operator()(k, bufferData, bufferSize, offset);
        res &= operator()(v, bufferData, bufferSize, offset);
        t[k] = std::move(v);
    }

    return res;
}